

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# newpfor.h
# Opt level: O0

void __thiscall
FastPForLib::NewPFor<4U,_FastPForLib::Simple16<false>_>::encodeBlock
          (NewPFor<4U,_FastPForLib::Simple16<false>_> *this,uint32_t *in,uint32_t *out,
          size_t *nvalue)

{
  uint uVar1;
  value_type vVar2;
  uint uVar3;
  reference pvVar4;
  byte bVar5;
  long *in_RCX;
  uint *in_RDX;
  long in_RSI;
  long *in_RDI;
  uint32_t i_4;
  uint32_t i_3;
  uint32_t i_2;
  uint32_t prev;
  uint32_t cur;
  uint32_t i_1;
  uint32_t i;
  uint32_t *initout;
  size_t encodedExceptions_sz;
  uint32_t nExceptions;
  uint32_t b;
  uint32_t len;
  size_t *in_stack_00000150;
  uint32_t *in_stack_00000158;
  size_t in_stack_00000160;
  uint32_t *in_stack_00000168;
  Simple16<false> *in_stack_00000170;
  long *in_stack_ffffffffffffff70;
  value_type in_stack_ffffffffffffff78;
  value_type in_stack_ffffffffffffff7c;
  value_type in_stack_ffffffffffffff80;
  value_type in_stack_ffffffffffffff84;
  uint local_5c;
  uint local_58;
  uint local_54;
  uint local_48;
  uint local_44;
  uint local_2c;
  uint *local_18;
  
  uVar3 = (**(code **)(*in_RDI + 0x48))(in_RDI,in_RSI,0x80);
  if (uVar3 < 0x20) {
    local_2c = 0;
    for (local_44 = 0; local_44 < 0x80; local_44 = local_44 + 1) {
      bVar5 = (byte)uVar3;
      if (*(uint *)(in_RSI + (ulong)local_44 * 4) < (uint)(1 << (bVar5 & 0x1f))) {
        vVar2 = *(value_type *)(in_RSI + (ulong)local_44 * 4);
        pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0xb),
                            (ulong)local_44);
        *pvVar4 = vVar2;
      }
      else {
        uVar1 = *(uint *)(in_RSI + (ulong)local_44 * 4);
        pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0xb),
                            (ulong)local_44);
        *pvVar4 = uVar1 & (1 << (bVar5 & 0x1f)) - 1U;
        pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 2),
                            (ulong)local_2c);
        *pvVar4 = local_44;
        uVar1 = *(uint *)(in_RSI + (ulong)local_44 * 4);
        pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 5),
                            (ulong)local_2c);
        *pvVar4 = uVar1 >> (bVar5 & 0x1f);
        local_2c = local_2c + 1;
      }
    }
    uVar1 = local_2c;
    if (local_2c != 0) {
      while (local_48 = uVar1 - 1, local_48 != 0) {
        pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 2),
                            (ulong)local_48);
        in_stack_ffffffffffffff84 = *pvVar4;
        pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 2),
                            (ulong)(uVar1 - 2));
        in_stack_ffffffffffffff84 = in_stack_ffffffffffffff84 - *pvVar4;
        pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 2),
                            (ulong)local_48);
        *pvVar4 = in_stack_ffffffffffffff84;
        uVar1 = local_48;
      }
      for (local_54 = 0; local_54 < local_2c; local_54 = local_54 + 1) {
        if (local_54 == 0) {
          pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 2),0)
          ;
          in_stack_ffffffffffffff78 = *pvVar4;
        }
        else {
          pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 2),
                              (ulong)local_54);
          in_stack_ffffffffffffff78 = *pvVar4 - 1;
        }
        in_stack_ffffffffffffff80 = in_stack_ffffffffffffff78;
        pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 8),
                            (ulong)local_54);
        *pvVar4 = in_stack_ffffffffffffff78;
        pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 5),
                            (ulong)local_54);
        in_stack_ffffffffffffff7c = *pvVar4 - 1;
        pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 8),
                            (ulong)(local_54 + local_2c));
        *pvVar4 = in_stack_ffffffffffffff7c;
      }
    }
    if (local_2c != 0) {
      in_stack_ffffffffffffff70 = in_RDI + 1;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 8),0);
      Simple16<false>::encodeArray
                (in_stack_00000170,in_stack_00000168,in_stack_00000160,in_stack_00000158,
                 in_stack_00000150);
    }
    local_18 = in_RDX + 1;
    *in_RDX = uVar3 << 0x1a | local_2c << 0x10;
    for (local_58 = 0; local_58 < 0x80; local_58 = local_58 + 0x20) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0xb),
                 (ulong)local_58);
      fastpackwithoutmask((uint32_t *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                          (uint32_t *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                          (uint32_t)((ulong)in_stack_ffffffffffffff70 >> 0x20));
      local_18 = local_18 + uVar3;
    }
    *in_RCX = (long)local_18 - (long)in_RDX >> 2;
  }
  else {
    *in_RDX = uVar3 << 0x1a;
    for (local_5c = 0; local_5c < 0x80; local_5c = local_5c + 1) {
      in_RDX[(ulong)local_5c + 1] = *(uint *)(in_RSI + (ulong)local_5c * 4);
    }
    *in_RCX = 0x81;
  }
  return;
}

Assistant:

void NewPFor<BlockSizeInUnitsOfPackSize, ExceptionCoder>::encodeBlock(
    const uint32_t *in, uint32_t *out, size_t &nvalue) {
  const uint32_t len = BlockSize;

  uint32_t b = findBestB(in, len);
  if (b < 32) {

    uint32_t nExceptions = 0;
    size_t encodedExceptions_sz = 0;

    const uint32_t *const initout(out);
    for (uint32_t i = 0; i < len; i++) {

      if (in[i] >= (1U << b)) {
        tobecoded[i] = in[i] & ((1U << b) - 1);
        exceptionsPositions[nExceptions] = i;
        exceptionsValues[nExceptions] = (in[i] >> b);
        nExceptions++;
      } else {
        tobecoded[i] = in[i];
      }
    }

    if (nExceptions > 0) {

      for (uint32_t i = nExceptions - 1; i > 0; i--) {
        const uint32_t cur = exceptionsPositions[i];
        const uint32_t prev = exceptionsPositions[i - 1];

        exceptionsPositions[i] = cur - prev;
      }

      for (uint32_t i = 0; i < nExceptions; i++) {

        exceptions[i] =
            (i > 0) ? exceptionsPositions[i] - 1 : exceptionsPositions[i];
        exceptions[i + nExceptions] = exceptionsValues[i] - 1;
      }
    }

    if (nExceptions > 0)
      ecoder.encodeArray(&exceptions[0], 2 * nExceptions, out + 1,
                         encodedExceptions_sz);
    *out++ = (b << (PFORDELTA_NEXCEPT + PFORDELTA_EXCEPTSZ)) |
             (nExceptions << PFORDELTA_EXCEPTSZ) |
             static_cast<uint32_t>(encodedExceptions_sz);
    /* Write exceptional values */

    out += static_cast<uint32_t>(encodedExceptions_sz);
    for (uint32_t i = 0; i < len; i += 32) {
      fastpackwithoutmask(&tobecoded[i], out, b);
      out += b;
    }
    nvalue = out - initout;

  } else {
    *out++ = (b << (PFORDELTA_NEXCEPT + PFORDELTA_EXCEPTSZ));
    for (uint32_t i = 0; i < len; i++)
      out[i] = in[i];
    nvalue = len + 1;
  }
}